

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplesort.hpp
# Opt level: O0

vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> * __thiscall
mxx::impl::
sample_arbit_decomp<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::less<std::pair<int,int>>>
          (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
           *__return_storage_ptr__,impl *this,
          __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          begin,comm *end,size_t param_5,comm *param_6)

{
  int iVar1;
  int iVar2;
  unsigned_long *puVar3;
  unsigned_long uVar4;
  size_type sVar5;
  reference __p;
  reference pvVar6;
  comm *pcVar7;
  iterator iVar8;
  iterator iVar9;
  reference pvVar10;
  allocator<unsigned_long> local_f9;
  value_type_conflict2 local_f8;
  undefined1 local_f0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_sizes;
  value_type my_splitter;
  size_t bucket_size;
  size_t i;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  pos;
  undefined1 local_90 [8];
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_splitters;
  ulong local_70;
  unsigned_long local_68;
  size_t local_s;
  unsigned_long uStack_58;
  int p;
  size_t total_size;
  impl *local_48;
  ulong local_40;
  size_t local_size;
  comm *comm_local;
  size_t s_local;
  pair<int,_int> *local_20;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  end_local;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  begin_local;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *result_splitters;
  
  total_size = (size_t)begin._M_current;
  local_48 = this;
  local_size = param_5;
  comm_local = end;
  local_20 = begin._M_current;
  end_local._M_current = (pair<int,_int> *)this;
  local_40 = std::
             distance<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                       ((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                         )this,begin);
  uStack_58 = allreduce<unsigned_long>(&local_40,(comm *)local_size);
  local_s._4_4_ = mxx::comm::size((comm *)local_size);
  if (local_40 == 0) {
    local_68 = 0;
  }
  else {
    local_70 = ((local_40 * (long)comm_local * (long)local_s._4_4_ + uStack_58) - 1) / uStack_58;
    local_splitters.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x1;
    puVar3 = std::max<unsigned_long>
                       (&local_70,
                        (unsigned_long *)
                        &local_splitters.
                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_68 = *puVar3;
  }
  uVar4 = allreduce<unsigned_long>(&local_68,(comm *)local_size);
  if (uVar4 < (ulong)((long)local_s._4_4_ * (long)comm_local)) {
    assert_fail("mxx::allreduce(local_s, comm) >= p*s",
                "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/samplesort.hpp"
                ,0x71,"sample_arbit_decomp");
  }
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_90);
  if (local_68 != 0) {
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::resize
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_90,
               local_68);
    i = (size_t)end_local._M_current;
    for (bucket_size = 0;
        sVar5 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                          ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                           local_90), bucket_size < sVar5; bucket_size = bucket_size + 1) {
      __gnu_cxx::
      __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
      ::operator+=((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                    *)&i,local_40 / (local_68 + 1) +
                         (long)(int)(uint)(bucket_size < local_40 % (local_68 + 1)) + -1);
      __p = __gnu_cxx::
            __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
            ::operator*((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                         *)&i);
      pvVar6 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                         ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                          local_90,bucket_size);
      std::pair<int,_int>::operator=(pvVar6,__p);
      __gnu_cxx::
      __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
      ::operator++((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                    *)&i);
    }
  }
  distribute_inplace<std::pair<int,int>>
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_90,
             (comm *)local_size);
  pcVar7 = (comm *)std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                             ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                              local_90);
  if (pcVar7 != comm_local) {
    pcVar7 = (comm *)std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                               ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                 *)local_90);
    if (pcVar7 <= comm_local) {
      assert_fail("local_splitters.size() > s",
                  "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/samplesort.hpp"
                  ,0x89,"sample_arbit_decomp");
    }
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::resize
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_90,
               (size_type)comm_local);
  }
  iVar8 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                    ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_90)
  ;
  iVar9 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                    ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_90)
  ;
  bitonic_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::less<std::pair<int,int>>>
            (iVar8._M_current,iVar9._M_current,local_size);
  pvVar6 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::back
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_90
                     );
  recv_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = *(pointer *)pvVar6;
  iVar1 = mxx::comm::size((comm *)local_size);
  local_f8 = 1;
  std::allocator<unsigned_long>::allocator(&local_f9);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f0,(long)iVar1,&local_f8
             ,&local_f9);
  std::allocator<unsigned_long>::~allocator(&local_f9);
  pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f0);
  *pvVar10 = 0;
  iVar1 = mxx::comm::rank((comm *)local_size);
  iVar2 = mxx::comm::size((comm *)local_size);
  allgatherv<std::pair<int,int>>
            (__return_storage_ptr__,
             (mxx *)&recv_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,
             (pair<int,_int> *)(ulong)(iVar1 + 1 < iVar2),(size_t)local_f0,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_size,param_6);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f0);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_90);
  return __return_storage_ptr__;
}

Assistant:

std::vector<typename std::iterator_traits<_Iterator>::value_type>
sample_arbit_decomp(_Iterator begin, _Iterator end, _Compare comp, size_t s, const mxx::comm& comm) {
    typedef typename std::iterator_traits<_Iterator>::value_type value_type;
    size_t local_size = std::distance(begin, end);

    // get total size n
    size_t total_size = mxx::allreduce(local_size, comm);

    // p = number of processes
    int p = comm.size();

    //  pick a total of s*p samples, thus locally pick ceil((local_size/n)*s*p)
    //  and at least one samples from each processor.
    //  this will result in at least s*p samples.
    size_t local_s;
    if (local_size == 0)
        local_s = 0;
    else
        local_s = std::max<size_t>(((local_size*s*p)+total_size-1)/total_size, 1);

    MXX_ASSERT(mxx::allreduce(local_s, comm) >= p*s);

    // init samples
    std::vector<value_type> local_splitters;

    // pick local samples
    if (local_s > 0) {
        local_splitters.resize(local_s);
        _Iterator pos = begin;
        for (size_t i = 0; i < local_splitters.size(); ++i)
        {
            size_t bucket_size = local_size / (local_s+1) + (i < (local_size % (local_s+1)) ? 1 : 0);
            // pick last element of each bucket
            pos += (bucket_size-1);
            local_splitters[i] = *pos;
            ++pos;
        }
    }

    // distribute elements equally
    mxx::distribute_inplace(local_splitters, comm);

    // discard extra splitters, to make it even
    if (local_splitters.size() != s) {
        MXX_ASSERT(local_splitters.size() > s);
        local_splitters.resize(s);
    }

    // sort splitters using parallel bitonic sort
    bitonic_sort(local_splitters.begin(), local_splitters.end(), comp, comm);

    // select the last element on each process but the last
    value_type my_splitter = local_splitters.back();
    // allgather splitters (from all but the last processor)
    std::vector<size_t> recv_sizes(comm.size(), 1);
    recv_sizes.back() = 0;
    std::vector<value_type> result_splitters = mxx::allgatherv(&my_splitter, (comm.rank() + 1 < comm.size()) ? 1 : 0, recv_sizes, comm);

    // return resulting splitters
    return result_splitters;
}